

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall
mjs::for_statement::for_statement
          (for_statement *this,source_extend *extend,statement_ptr *init,expression_ptr *cond,
          expression_ptr *iter,statement_ptr *s)

{
  statement *psVar1;
  int iVar2;
  
  statement::syntax_node(&this->super_statement,extend);
  (this->super_statement).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__for_statement_001c26d8;
  (this->init_)._M_t.super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>.
  _M_t.super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
  super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl =
       (init->_M_t).super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t
       .super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
       super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
  (init->_M_t).super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
  super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
  super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl = (statement *)0x0;
  (this->cond_)._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
  _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
  super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl =
       (cond->_M_t).super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
       _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
       super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
  (cond->_M_t).super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
  super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
  super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl = (expression *)0x0;
  (this->iter_)._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
  _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
  super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl =
       (iter->_M_t).super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
       _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
       super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
  (iter->_M_t).super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
  super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
  super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl = (expression *)0x0;
  (this->s_)._M_t.super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
  super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
  super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl =
       (s->_M_t).super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
       super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
       super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
  (s->_M_t).super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
  super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
  super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl = (statement *)0x0;
  psVar1 = (this->init_)._M_t.
           super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
           super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
           super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
  if (psVar1 != (statement *)0x0) {
    iVar2 = (**(code **)((long)(psVar1->super_syntax_node)._vptr_syntax_node + 0x18))();
    if (iVar2 != 4) {
      iVar2 = (**(code **)((long)(((this->init_)._M_t.
                                   super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>
                                   .super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl)->
                                 super_syntax_node)._vptr_syntax_node + 0x18))();
      if (iVar2 != 1) {
        __assert_fail("!init_ || init_->type() == statement_type::expression || init_->type() == statement_type::variable"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h"
                      ,0x2aa,
                      "mjs::for_statement::for_statement(const source_extend &, statement_ptr &&, expression_ptr &&, expression_ptr &&, statement_ptr &&)"
                     );
      }
    }
  }
  if ((this->s_)._M_t.super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>.
      _M_t.super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
      super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl != (statement *)0x0) {
    return;
  }
  __assert_fail("s_",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                0x2ab,
                "mjs::for_statement::for_statement(const source_extend &, statement_ptr &&, expression_ptr &&, expression_ptr &&, statement_ptr &&)"
               );
}

Assistant:

explicit for_statement(const source_extend& extend, statement_ptr&& init, expression_ptr&& cond, expression_ptr&& iter, statement_ptr&& s) : statement(extend), init_(std::move(init)), cond_(std::move(cond)), iter_(std::move(iter)), s_(std::move(s)) {
        assert(!init_ || init_->type() == statement_type::expression || init_->type() == statement_type::variable);
        assert(s_);
    }